

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

int ParseEXRHeaderFromFile(EXRHeader *exr_header,EXRVersion *exr_version,char *filename,char **err)

{
  char **ppcVar1;
  bool bVar2;
  allocator local_c1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  undefined1 local_80 [8];
  MemoryMappedFile file;
  allocator local_51;
  string local_50;
  char **local_30;
  char **err_local;
  char *filename_local;
  EXRVersion *exr_version_local;
  EXRHeader *exr_header_local;
  
  local_30 = err;
  err_local = (char **)filename;
  filename_local = (char *)exr_version;
  exr_version_local = (EXRVersion *)exr_header;
  if (((exr_header == (EXRHeader *)0x0) || (exr_version == (EXRVersion *)0x0)) ||
     (filename == (char *)0x0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_50,"Invalid argument for ParseEXRHeaderFromFile",&local_51);
    tinyexr::SetErrorMessage(&local_50,local_30);
    std::__cxx11::string::~string((string *)&local_50);
    std::allocator<char>::~allocator((allocator<char> *)&local_51);
    exr_header_local._4_4_ = -3;
  }
  else {
    MemoryMappedFile::MemoryMappedFile((MemoryMappedFile *)local_80,filename);
    bVar2 = MemoryMappedFile::valid((MemoryMappedFile *)local_80);
    ppcVar1 = err_local;
    if (bVar2) {
      exr_header_local._4_4_ =
           ParseEXRHeaderFromMemory
                     ((EXRHeader *)exr_version_local,(EXRVersion *)filename_local,(uchar *)local_80,
                      (size_t)file.data,local_30);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_c0,(char *)ppcVar1,&local_c1);
      std::operator+(&local_a0,"Cannot read file ",&local_c0);
      tinyexr::SetErrorMessage(&local_a0,local_30);
      std::__cxx11::string::~string((string *)&local_a0);
      std::__cxx11::string::~string((string *)&local_c0);
      std::allocator<char>::~allocator((allocator<char> *)&local_c1);
      exr_header_local._4_4_ = -7;
    }
    MemoryMappedFile::~MemoryMappedFile((MemoryMappedFile *)local_80);
  }
  return exr_header_local._4_4_;
}

Assistant:

int ParseEXRHeaderFromFile(EXRHeader *exr_header, const EXRVersion *exr_version,
                           const char *filename, const char **err) {
  if (exr_header == NULL || exr_version == NULL || filename == NULL) {
    tinyexr::SetErrorMessage("Invalid argument for ParseEXRHeaderFromFile",
                             err);
    return TINYEXR_ERROR_INVALID_ARGUMENT;
  }

  MemoryMappedFile file(filename);
  if (!file.valid()) {
    tinyexr::SetErrorMessage("Cannot read file " + std::string(filename), err);
    return TINYEXR_ERROR_CANT_OPEN_FILE;
  }

  return ParseEXRHeaderFromMemory(exr_header, exr_version, file.data, file.size,
                                  err);
}